

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_service_client(t_ocaml_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *os;
  ofstream_with_content_based_conditional_update *os_00;
  int *piVar1;
  t_struct *ptVar2;
  t_function *ptVar3;
  t_type *returntype;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  pointer pptVar7;
  pointer pptVar8;
  allocator local_399;
  string local_398;
  string res;
  string resultname;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends;
  string funname;
  t_struct noargs;
  string argsname;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  t_function recv_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&extends,"",(allocator *)&noargs);
  os = &this->f_service_;
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,"class client (iprot : Protocol.t) (oprot : Protocol.t) =");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"object (self)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  os_00 = &this->f_service_i_;
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os_00);
  poVar5 = std::operator<<(poVar5,"class client : Protocol.t -> Protocol.t -> ");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"object");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_((string *)&noargs,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&extends,(string *)&noargs);
    std::__cxx11::string::~string((string *)&noargs);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"inherit ");
    poVar5 = std::operator<<(poVar5,(string *)&extends);
    poVar5 = std::operator<<(poVar5,".client iprot oprot as super");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os_00);
    poVar5 = std::operator<<(poVar5,"inherit ");
    poVar5 = std::operator<<(poVar5,(string *)&extends);
    poVar5 = std::operator<<(poVar5,".client");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,"val mutable seqid = 0");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  for (pptVar8 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar8 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
    ptVar2 = (*pptVar8)->arglist_;
    std::__cxx11::string::string((string *)&funname,(string *)&(*pptVar8)->name_);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"method ");
    ptVar3 = *pptVar8;
    std::__cxx11::string::string((string *)&local_150,"",(allocator *)&recv_function);
    function_signature((string *)&noargs,this,ptVar3,&local_150);
    poVar5 = std::operator<<(poVar5,(string *)&noargs);
    poVar5 = std::operator<<(poVar5," = ");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&noargs);
    std::__cxx11::string::~string((string *)&local_150);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os_00);
    poVar5 = std::operator<<(poVar5,"method ");
    std::__cxx11::string::string((string *)&local_170,(string *)&(*pptVar8)->name_);
    t_generator::decapitalize((string *)&noargs,(t_generator *)this,&local_170);
    poVar5 = std::operator<<(poVar5,(string *)&noargs);
    poVar5 = std::operator<<(poVar5," : ");
    function_type_abi_cxx11_((string *)&recv_function,this,*pptVar8,true,false);
    poVar5 = std::operator<<(poVar5,(string *)&recv_function);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&recv_function);
    std::__cxx11::string::~string((string *)&noargs);
    std::__cxx11::string::~string((string *)&local_170);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"self#send_");
    std::operator<<(poVar5,(string *)&funname);
    for (pptVar7 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar7 !=
        (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      poVar5 = std::operator<<((ostream *)os," ");
      std::__cxx11::string::string((string *)&local_190,(string *)&(*pptVar7)->name_);
      t_generator::decapitalize((string *)&noargs,(t_generator *)this,&local_190);
      std::operator<<(poVar5,(string *)&noargs);
      std::__cxx11::string::~string((string *)&noargs);
      std::__cxx11::string::~string((string *)&local_190);
    }
    poVar5 = std::operator<<((ostream *)os,";");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    if ((*pptVar8)->oneway_ == false) {
      t_generator::indent_abi_cxx11_((string *)&noargs,(t_generator *)this);
      std::operator<<((ostream *)os,(string *)&noargs);
      std::__cxx11::string::~string((string *)&noargs);
      poVar5 = std::operator<<((ostream *)os,"self#recv_");
      poVar5 = std::operator<<(poVar5,(string *)&funname);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"method private send_");
    ptVar3 = *pptVar8;
    std::__cxx11::string::string((string *)&local_1b0,"",(allocator *)&recv_function);
    function_signature((string *)&noargs,this,ptVar3,&local_1b0);
    poVar5 = std::operator<<(poVar5,(string *)&noargs);
    poVar5 = std::operator<<(poVar5," = ");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&noargs);
    std::__cxx11::string::~string((string *)&local_1b0);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    std::operator+(&local_50,&(*pptVar8)->name_,"_args");
    t_generator::decapitalize(&argsname,(t_generator *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    t_generator::indent_abi_cxx11_((string *)&noargs,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)os,(string *)&noargs);
    poVar5 = std::operator<<(poVar5,"oprot#writeMessageBegin (\"");
    poVar5 = std::operator<<(poVar5,(string *)&(*pptVar8)->name_);
    poVar5 = std::operator<<(poVar5,"\", ");
    pcVar6 = "Protocol.CALL";
    if ((*pptVar8)->oneway_ != false) {
      pcVar6 = "Protocol.ONEWAY";
    }
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,", seqid);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&noargs);
    t_generator::indent_abi_cxx11_((string *)&noargs,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)os,(string *)&noargs);
    poVar5 = std::operator<<(poVar5,"let args = new ");
    poVar5 = std::operator<<(poVar5,(string *)&argsname);
    poVar5 = std::operator<<(poVar5," in");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&noargs);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    for (pptVar7 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar7 !=
        (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      t_generator::indent_abi_cxx11_((string *)&noargs,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)os,(string *)&noargs);
      poVar5 = std::operator<<(poVar5,"args#set_");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar7)->name_);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar7)->name_);
      poVar5 = std::operator<<(poVar5,";");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&noargs);
    }
    t_generator::indent_abi_cxx11_((string *)&noargs,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)os,(string *)&noargs);
    poVar5 = std::operator<<(poVar5,"args#write oprot;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&recv_function,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&recv_function);
    poVar5 = std::operator<<(poVar5,"oprot#writeMessageEnd;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&resultname,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&resultname);
    poVar5 = std::operator<<(poVar5,"oprot#getTransport#flush");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&resultname);
    std::__cxx11::string::~string((string *)&recv_function);
    std::__cxx11::string::~string((string *)&noargs);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -2;
    if ((*pptVar8)->oneway_ == false) {
      std::operator+(&local_70,&(*pptVar8)->name_,"_result");
      t_generator::decapitalize(&resultname,(t_generator *)this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      t_struct::t_struct(&noargs,(this->super_t_oop_generator).super_t_generator.program_);
      returntype = (*pptVar8)->returntype_;
      std::__cxx11::string::string((string *)&res,"recv_",(allocator *)&local_398);
      std::operator+(&local_90,&res,&(*pptVar8)->name_);
      t_function::t_function(&recv_function,returntype,&local_90,&noargs,false);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&res);
      t_generator::indent_abi_cxx11_(&res,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)os,(string *)&res);
      poVar5 = std::operator<<(poVar5,"method private ");
      std::__cxx11::string::string((string *)&local_1d0,"",&local_399);
      function_signature(&local_398,this,&recv_function,&local_1d0);
      poVar5 = std::operator<<(poVar5,(string *)&local_398);
      poVar5 = std::operator<<(poVar5," =");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&res);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&res,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)os,(string *)&res);
      poVar5 = std::operator<<(poVar5,"let (fname, mtype, rseqid) = iprot#readMessageBegin in");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&res);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&res,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)os,(string *)&res);
      poVar5 = std::operator<<(poVar5,"(if mtype = Protocol.EXCEPTION then");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_398,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_398);
      poVar5 = std::operator<<(poVar5,"  let x = Application_Exn.read iprot in");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&res);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&res,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)os,(string *)&res);
      poVar5 = std::operator<<(poVar5,"  (iprot#readMessageEnd;");
      t_generator::indent_abi_cxx11_(&local_398,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_398);
      poVar5 = std::operator<<(poVar5,"   raise (Application_Exn.E x))");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&res);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&res,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)os,(string *)&res);
      poVar5 = std::operator<<(poVar5,"else ());");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&res);
      std::__cxx11::string::string((string *)&res,"_",(allocator *)&local_398);
      ptVar2 = (*pptVar8)->xceptions_;
      iVar4 = (*((*pptVar8)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if (((char)iVar4 == '\0') ||
         ((ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_start)) {
        std::__cxx11::string::assign((char *)&res);
      }
      t_generator::indent_abi_cxx11_(&local_398,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)os,(string *)&local_398);
      poVar5 = std::operator<<(poVar5,"let ");
      poVar5 = std::operator<<(poVar5,(string *)&res);
      poVar5 = std::operator<<(poVar5," = read_");
      poVar5 = std::operator<<(poVar5,(string *)&resultname);
      poVar5 = std::operator<<(poVar5," iprot in");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_398);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_398,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)os,(string *)&local_398);
      poVar5 = std::operator<<(poVar5,"iprot#readMessageEnd;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_398);
      iVar4 = (*((*pptVar8)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar4 == '\0') {
        t_generator::indent_abi_cxx11_(&local_398,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)os,(string *)&local_398);
        poVar5 = std::operator<<(poVar5,"match result#get_success with Some v -> v | None -> (");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_398);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
      }
      for (pptVar7 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar7 !=
          (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
        t_generator::indent_abi_cxx11_(&local_398,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)os,(string *)&local_398);
        poVar5 = std::operator<<(poVar5,"(match result#get_");
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar7)->name_);
        poVar5 = std::operator<<(poVar5," with None -> () | Some _v ->");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_398);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
        poVar5 = std::operator<<(poVar5,"  raise (");
        type_name_abi_cxx11_(&local_1f0,this,(*pptVar7)->type_);
        t_generator::capitalize(&local_398,(t_generator *)this,&local_1f0);
        poVar5 = std::operator<<(poVar5,(string *)&local_398);
        poVar5 = std::operator<<(poVar5," _v));");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
      iVar4 = (*((*pptVar8)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar4 == '\0') {
        t_generator::indent_abi_cxx11_(&local_398,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)os,(string *)&local_398);
        poVar5 = std::operator<<(poVar5,
                                 "raise (Application_Exn.E (Application_Exn.create Application_Exn.MISSING_RESULT \""
                                );
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar8)->name_);
        poVar5 = std::operator<<(poVar5," failed: unknown result\")))");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_398);
        iVar4 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
        (this->super_t_oop_generator).super_t_generator.indent_ = iVar4;
      }
      else {
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
        poVar5 = std::operator<<(poVar5,"()");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        iVar4 = (this->super_t_oop_generator).super_t_generator.indent_;
      }
      (this->super_t_oop_generator).super_t_generator.indent_ = iVar4 + -3;
      std::__cxx11::string::~string((string *)&res);
      t_function::~t_function(&recv_function);
      t_struct::~t_struct(&noargs);
      std::__cxx11::string::~string((string *)&resultname);
    }
    std::__cxx11::string::~string((string *)&argsname);
    std::__cxx11::string::~string((string *)&funname);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,"end");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os_00);
  poVar5 = std::operator<<(poVar5,"end");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  std::__cxx11::string::~string((string *)&extends);
  return;
}

Assistant:

void t_ocaml_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  indent(f_service_) << "class client (iprot : Protocol.t) (oprot : Protocol.t) =" << endl
                     << "object (self)" << endl;
  indent(f_service_i_) << "class client : Protocol.t -> Protocol.t -> " << endl << "object" << endl;
  indent_up();

  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    indent(f_service_) << "inherit " << extends << ".client iprot oprot as super" << endl;
    indent(f_service_i_) << "inherit " << extends << ".client" << endl;
  }
  indent(f_service_) << "val mutable seqid = 0" << endl;

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* arg_struct = (*f_iter)->get_arglist();
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator fld_iter;
    string funname = (*f_iter)->get_name();

    // Open function
    indent(f_service_) << "method " << function_signature(*f_iter) << " = " << endl;
    indent(f_service_i_) << "method " << decapitalize((*f_iter)->get_name()) << " : "
                         << function_type(*f_iter, true, false) << endl;
    indent_up();
    indent(f_service_) << "self#send_" << funname;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << " " << decapitalize((*fld_iter)->get_name());
    }
    f_service_ << ";" << endl;

    if (!(*f_iter)->is_oneway()) {
      f_service_ << indent();
      f_service_ << "self#recv_" << funname << endl;
    }
    indent_down();

    indent(f_service_) << "method private send_" << function_signature(*f_iter) << " = " << endl;
    indent_up();

    std::string argsname = decapitalize((*f_iter)->get_name() + "_args");

    // Serialize the request header
    f_service_ << indent() << "oprot#writeMessageBegin (\"" << (*f_iter)->get_name() << "\", "
               << ((*f_iter)->is_oneway() ? "Protocol.ONEWAY" : "Protocol.CALL") << ", seqid);"
               << endl;

    f_service_ << indent() << "let args = new " << argsname << " in" << endl;
    indent_up();

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args#set_" << (*fld_iter)->get_name() << " "
                 << (*fld_iter)->get_name() << ";" << endl;
    }

    // Write to the stream
    f_service_ << indent() << "args#write oprot;" << endl << indent() << "oprot#writeMessageEnd;"
               << endl << indent() << "oprot#getTransport#flush" << endl;

    indent_down();
    indent_down();

    if (!(*f_iter)->is_oneway()) {
      std::string resultname = decapitalize((*f_iter)->get_name() + "_result");
      t_struct noargs(program_);

      t_function recv_function((*f_iter)->get_returntype(),
                               string("recv_") + (*f_iter)->get_name(),
                               &noargs);
      // Open function
      f_service_ << indent() << "method private " << function_signature(&recv_function) << " ="
                 << endl;
      indent_up();

      // TODO(mcslee): Validate message reply here, seq ids etc.

      f_service_ << indent() << "let (fname, mtype, rseqid) = iprot#readMessageBegin in" << endl;
      indent_up();
      f_service_ << indent() << "(if mtype = Protocol.EXCEPTION then" << endl << indent()
                 << "  let x = Application_Exn.read iprot in" << endl;
      indent_up();
      f_service_ << indent() << "  (iprot#readMessageEnd;" << indent()
                 << "   raise (Application_Exn.E x))" << endl;
      indent_down();
      f_service_ << indent() << "else ());" << endl;
      string res = "_";

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();

      if (!(*f_iter)->get_returntype()->is_void() || xceptions.size() > 0) {
        res = "result";
      }
      f_service_ << indent() << "let " << res << " = read_" << resultname << " iprot in" << endl;
      indent_up();
      f_service_ << indent() << "iprot#readMessageEnd;" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << indent() << "match result#get_success with Some v -> v | None -> (" << endl;
        indent_up();
      }

      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        f_service_ << indent() << "(match result#get_" << (*x_iter)->get_name()
                   << " with None -> () | Some _v ->" << endl;
        indent(f_service_) << "  raise (" << capitalize(type_name((*x_iter)->get_type()))
                           << " _v));" << endl;
      }

      // Careful, only return _result if not a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "()" << endl;
      } else {
        f_service_
            << indent()
            << "raise (Application_Exn.E (Application_Exn.create Application_Exn.MISSING_RESULT \""
            << (*f_iter)->get_name() << " failed: unknown result\")))" << endl;
        indent_down();
      }

      // Close function
      indent_down();
      indent_down();
      indent_down();
    }
  }

  indent_down();
  indent(f_service_) << "end" << endl << endl;
  indent(f_service_i_) << "end" << endl << endl;
}